

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::bldFineLevels(Amr *this,Real strt_time)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  Geometry *pGVar5;
  BoxArray *pBVar6;
  ulong uVar7;
  pointer pAVar8;
  long *in_RDI;
  double in_XMM0_Qa;
  int i_1;
  int i;
  int count;
  int MaxCnt;
  bool grids_the_same;
  AmrLevel *level;
  DistributionMapping new_dm;
  int new_finest;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grids;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_00000270;
  int *in_stack_00000278;
  Real in_stack_00000280;
  int in_stack_0000028c;
  Amr *in_stack_00000290;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  BoxArray *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_6c;
  int local_68;
  int local_64;
  undefined1 local_50 [16];
  int local_40;
  double local_10;
  
  *(undefined4 *)((long)in_RDI + 0x94) = 0;
  local_10 = in_XMM0_Qa;
  std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x10e89ad);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (allocator_type *)0x10e89c4);
  std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x10e89d3);
  do {
    grid_places(in_stack_00000290,in_stack_0000028c,in_stack_00000280,in_stack_00000278,
                in_stack_00000270);
    if (local_40 <= *(int *)((long)in_RDI + 0x94)) break;
    *(int *)((long)in_RDI + 0x94) = local_40;
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    ParallelDescriptor::NProcs();
    DistributionMapping::DistributionMapping
              ((DistributionMapping *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
    iVar3 = local_40;
    plVar1 = (long *)in_RDI[0x12d];
    pGVar5 = AmrMesh::Geom((AmrMesh *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff1c);
    pBVar6 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                       ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                        CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    (**(code **)(*plVar1 + 0x30))(local_10,plVar1,in_RDI,iVar3,pGVar5,pBVar6,local_50);
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::reset
              ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (pointer)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    in_stack_ffffffffffffff44 = local_40;
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    AmrMesh::SetBoxArray
              ((AmrMesh *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (BoxArray *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    AmrMesh::SetDistributionMap
              ((AmrMesh *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (DistributionMapping *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20))
    ;
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    pAVar8 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        0x10e8ba9);
    (*pAVar8->_vptr_AmrLevel[0x17])();
    DistributionMapping::~DistributionMapping((DistributionMapping *)0x10e8bc7);
  } while (*(int *)((long)in_RDI + 0x94) < *(int *)((long)in_RDI + 0xc));
  uVar7 = std::__cxx11::string::empty();
  if (((uVar7 & 1) != 0) ||
     (((local_10 == 0.0 && (!NAN(local_10))) &&
      (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)))) {
    local_64 = 0;
    do {
      for (local_68 = 0; local_68 <= *(int *)((long)in_RDI + 0x94); local_68 = local_68 + 1) {
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        pAVar8 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x10e8c7f);
        in_stack_ffffffffffffff38 = AmrLevel::boxArray(pAVar8);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        BoxArray::operator=((BoxArray *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                            (BoxArray *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      (**(code **)(*in_RDI + 0x38))(local_10,in_RDI,0,1);
      bVar2 = true;
      local_6c = 0;
      while( true ) {
        bVar4 = false;
        if (local_6c <= *(int *)((long)in_RDI + 0x94)) {
          bVar4 = bVar2;
        }
        if (!bVar4) break;
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        pAVar8 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                           ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                            0x10e8d78);
        AmrLevel::boxArray(pAVar8);
        bVar4 = BoxArray::operator==
                          ((BoxArray *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                           ,in_stack_ffffffffffffff38);
        if (!bVar4) {
          bVar2 = false;
        }
        local_6c = local_6c + 1;
      }
      local_64 = local_64 + 1;
      in_stack_ffffffffffffff27 = !bVar2 && local_64 < 4;
    } while ((bool)in_stack_ffffffffffffff27);
  }
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x10e8df6);
  return;
}

Assistant:

void
Amr::bldFineLevels (Real strt_time)
{
    BL_PROFILE("Amr::bldFineLevels()");
    finest_level = 0;

    Vector<BoxArray> new_grids(max_level+1);
    //
    // Get initial grid placement.
    //
    do
    {
        int new_finest;

        grid_places(finest_level,strt_time,new_finest,new_grids);

        if (new_finest <= finest_level) break;
        //
        // Create a new level and link with others.
        //
        finest_level = new_finest;

        DistributionMapping new_dm {new_grids[new_finest]};

        AmrLevel* level = (*levelbld)(*this,
                                      new_finest,
                                      Geom(new_finest),
                                      new_grids[new_finest],
                                      new_dm,
                                      strt_time);

        amr_level[new_finest].reset(level);
        this->SetBoxArray(new_finest, new_grids[new_finest]);
        this->SetDistributionMap(new_finest, new_dm);

        amr_level[new_finest]->initData();
    }
    while (finest_level < max_level);
    //
    // Iterate grids to ensure fine grids encompass all interesting gunk.
    //     but only iterate if we did not provide a grids file.
    //
    if ( regrid_grids_file.empty() || (strt_time == 0.0 && !initial_grids_file.empty()) )
    {
        bool grids_the_same;

        const int MaxCnt = 4;

        int count = 0;

        do
        {
            for (int i = 0; i <= finest_level; i++) {
                new_grids[i] = amr_level[i]->boxArray();
            }

            regrid(0,strt_time,true);

            grids_the_same = true;

            for (int i = 0; i <= finest_level && grids_the_same; i++) {
                if (!(new_grids[i] == amr_level[i]->boxArray())) {
                    grids_the_same = false;
                }
            }

            count++;
        }
        while (!grids_the_same && count < MaxCnt);
    }
}